

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.hpp
# Opt level: O0

void __thiscall
helics::apps::AsioBrokerServer::AsioBrokerServer(AsioBrokerServer *this,string_view server_name)

{
  TypedBrokerServer *in_RDI;
  allocator<char> *__a;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> local_19;
  
  TypedBrokerServer::TypedBrokerServer(in_RDI);
  in_RDI->_vptr_TypedBrokerServer = (_func_int **)&PTR__AsioBrokerServer_00a43500;
  CLI::std::shared_ptr<gmlc::networking::TcpServer>::shared_ptr
            ((shared_ptr<gmlc::networking::TcpServer> *)0x1f3ae3);
  CLI::std::
  vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
  ::vector((vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
            *)0x1f3af6);
  CLI::std::shared_ptr<helics::udp::UdpServer>::shared_ptr
            ((shared_ptr<helics::udp::UdpServer> *)0x1f3b09);
  CLI::std::
  vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
  ::vector((vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
            *)0x1f3b1c);
  CLI::std::thread::thread((thread *)0x1f3b2f);
  CLI::std::mutex::mutex((mutex *)0x1f3b3d);
  in_RDI[0x11]._vptr_TypedBrokerServer = (_func_int **)0x0;
  __a = (allocator<char> *)(in_RDI + 0x12);
  __t = &local_19;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffd0,__t,__a);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  *(undefined1 *)&in_RDI[0x16]._vptr_TypedBrokerServer = 0;
  *(undefined1 *)((long)&in_RDI[0x16]._vptr_TypedBrokerServer + 1) = 0;
  return;
}

Assistant:

explicit AsioBrokerServer(std::string_view server_name): name_(server_name) {}